

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_vli lzma_index_size(lzma_index *i)

{
  lzma_vli lVar1;
  
  lVar1 = index_size(i->record_count,i->index_list_size);
  return lVar1;
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_index_size(const lzma_index *i)
{
	return index_size(i->record_count, i->index_list_size);
}